

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

Parse * verona::parser(void)

{
  initializer_list<std::pair<trieste::Token,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>_>_>
  g;
  initializer_list<std::shared_ptr<trieste::detail::RuleDef>_> r;
  initializer_list<std::shared_ptr<trieste::detail::RuleDef>_> r_00;
  initializer_list<std::shared_ptr<trieste::detail::RuleDef>_> r_01;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this;
  Parse *in_RDI;
  pair<trieste::Token,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>_>
  *local_1f18;
  shared_ptr<trieste::detail::RuleDef> *local_1e80;
  shared_ptr<trieste::detail::RuleDef> *local_1e28;
  shared_ptr<trieste::detail::RuleDef> *local_1de0;
  anon_class_1_0_00000001 local_1a51;
  GenLocationF local_1a50;
  Token local_1a30;
  anon_class_1_0_00000001 local_1a21;
  GenLocationF local_1a20;
  Token local_1a00;
  anon_class_1_0_00000001 local_19f1;
  GenLocationF local_19f0;
  Token local_19d0;
  anon_class_1_0_00000001 local_19c1;
  GenLocationF local_19c0;
  Token local_19a0;
  anon_class_1_0_00000001 local_1991;
  GenLocationF local_1990;
  Token local_1970;
  anon_class_1_0_00000001 local_1961;
  GenLocationF local_1960;
  Token local_1940;
  anon_class_1_0_00000001 local_1931;
  GenLocationF local_1930;
  Token local_1910;
  anon_class_1_0_00000001 local_1901;
  GenLocationF local_1900;
  Token local_18e0;
  pair<trieste::Token,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>_>
  *local_18d8;
  pair<trieste::Token,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>_>
  local_18d0;
  pair<trieste::Token,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>_>
  local_18a8;
  pair<trieste::Token,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>_>
  local_1880;
  pair<trieste::Token,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>_>
  local_1858;
  pair<trieste::Token,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>_>
  local_1830;
  pair<trieste::Token,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>_>
  local_1808;
  pair<trieste::Token,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>_>
  local_17e0;
  pair<trieste::Token,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>_>
  local_17b8;
  undefined1 local_1790 [16];
  anon_class_16_1_19103d30 local_1780;
  ParseEffect local_1770;
  undefined1 local_174a;
  anon_class_1_0_00000001 local_1749;
  ParseEffect local_1748;
  undefined **local_1728;
  DebugLocation local_1720;
  Located<const_char_*> local_1718;
  anon_class_16_1_a7cab9e3 local_1708;
  ParseEffect local_16f8;
  undefined **local_16d8;
  DebugLocation local_16d0;
  Located<const_char_*> local_16c8;
  anon_class_16_1_a7cab9e3 local_16b8;
  ParseEffect local_16a8;
  undefined **local_1688;
  DebugLocation local_1680;
  Located<const_char_*> local_1678;
  anon_class_1_0_00000001 local_1661;
  ParseEffect local_1660;
  undefined **local_1640;
  DebugLocation local_1638;
  Located<const_char_*> local_1630;
  trieste *local_1620;
  undefined1 local_1618 [32];
  trieste local_15f8 [16];
  trieste local_15e8 [16];
  shared_ptr<trieste::detail::RuleDef> local_15d8;
  allocator<char> local_15c1;
  string local_15c0;
  undefined1 local_1599;
  anon_class_16_1_ba1d7991 local_1598;
  ParseEffect local_1588;
  undefined **local_1568;
  DebugLocation local_1560;
  Located<const_char_*> local_1558;
  anon_class_16_1_ba1d7991 local_1548;
  ParseEffect local_1538;
  undefined **local_1518;
  DebugLocation local_1510;
  Located<const_char_*> local_1508;
  anon_class_16_1_ba1d7991 local_14f8;
  ParseEffect local_14e8;
  undefined **local_14c8;
  DebugLocation local_14c0;
  Located<const_char_*> local_14b8;
  trieste *local_14a8;
  undefined1 local_14a0 [32];
  trieste local_1480 [16];
  shared_ptr<trieste::detail::RuleDef> local_1470;
  allocator<char> local_1459;
  string local_1458;
  undefined1 local_1432;
  anon_class_1_0_00000001 local_1431;
  ParseEffect local_1430;
  undefined **local_1410;
  DebugLocation local_1408;
  Located<const_char_*> local_1400;
  anon_class_1_0_00000001 local_13e9;
  ParseEffect local_13e8;
  undefined **local_13c8;
  DebugLocation local_13c0;
  Located<const_char_*> local_13b8;
  anon_class_1_0_00000001 local_13a1;
  ParseEffect local_13a0;
  undefined **local_1380;
  DebugLocation local_1378;
  Located<const_char_*> local_1370;
  anon_class_1_0_00000001 local_1359;
  ParseEffect local_1358;
  undefined **local_1338;
  DebugLocation local_1330;
  Located<const_char_*> local_1328;
  anon_class_1_0_00000001 local_1311;
  ParseEffect local_1310;
  undefined **local_12f0;
  DebugLocation local_12e8;
  Located<const_char_*> local_12e0;
  anon_class_1_0_00000001 local_12c9;
  ParseEffect local_12c8;
  undefined **local_12a8;
  DebugLocation local_12a0;
  Located<const_char_*> local_1298;
  anon_class_1_0_00000001 local_1281;
  ParseEffect local_1280;
  undefined **local_1260;
  DebugLocation local_1258;
  Located<const_char_*> local_1250;
  anon_class_1_0_00000001 local_1239;
  ParseEffect local_1238;
  undefined **local_1218;
  DebugLocation local_1210;
  Located<const_char_*> local_1208;
  anon_class_1_0_00000001 local_11f1;
  ParseEffect local_11f0;
  undefined **local_11d0;
  DebugLocation local_11c8;
  Located<const_char_*> local_11c0;
  anon_class_1_0_00000001 local_11a9;
  ParseEffect local_11a8;
  undefined **local_1188;
  DebugLocation local_1180;
  Located<const_char_*> local_1178;
  anon_class_1_0_00000001 local_1161;
  ParseEffect local_1160;
  undefined **local_1140;
  DebugLocation local_1138;
  Located<const_char_*> local_1130;
  anon_class_1_0_00000001 local_1119;
  ParseEffect local_1118;
  undefined **local_10f8;
  DebugLocation local_10f0;
  Located<const_char_*> local_10e8;
  anon_class_1_0_00000001 local_10d1;
  ParseEffect local_10d0;
  undefined **local_10b0;
  DebugLocation local_10a8;
  Located<const_char_*> local_10a0;
  anon_class_1_0_00000001 local_1089;
  ParseEffect local_1088;
  undefined **local_1068;
  DebugLocation local_1060;
  Located<const_char_*> local_1058;
  anon_class_1_0_00000001 local_1041;
  ParseEffect local_1040;
  undefined **local_1020;
  DebugLocation local_1018;
  Located<const_char_*> local_1010;
  anon_class_1_0_00000001 local_ff9;
  ParseEffect local_ff8;
  undefined **local_fd8;
  DebugLocation local_fd0;
  Located<const_char_*> local_fc8;
  anon_class_1_0_00000001 local_fb1;
  ParseEffect local_fb0;
  undefined **local_f90;
  DebugLocation local_f88;
  Located<const_char_*> local_f80;
  anon_class_1_0_00000001 local_f69;
  ParseEffect local_f68;
  undefined **local_f48;
  DebugLocation local_f40;
  Located<const_char_*> local_f38;
  anon_class_1_0_00000001 local_f21;
  ParseEffect local_f20;
  undefined **local_f00;
  DebugLocation local_ef8;
  Located<const_char_*> local_ef0;
  anon_class_1_0_00000001 local_ed9;
  ParseEffect local_ed8;
  undefined **local_eb8;
  DebugLocation local_eb0;
  Located<const_char_*> local_ea8;
  anon_class_1_0_00000001 local_e91;
  ParseEffect local_e90;
  undefined **local_e70;
  DebugLocation local_e68;
  Located<const_char_*> local_e60;
  anon_class_1_0_00000001 local_e49;
  ParseEffect local_e48;
  undefined **local_e28;
  DebugLocation local_e20;
  Located<const_char_*> local_e18;
  anon_class_1_0_00000001 local_e01;
  ParseEffect local_e00;
  undefined **local_de0;
  DebugLocation local_dd8;
  Located<const_char_*> local_dd0;
  anon_class_1_0_00000001 local_db9;
  ParseEffect local_db8;
  undefined **local_d98;
  DebugLocation local_d90;
  Located<const_char_*> local_d88;
  anon_class_1_0_00000001 local_d71;
  ParseEffect local_d70;
  undefined **local_d50;
  DebugLocation local_d48;
  Located<const_char_*> local_d40;
  anon_class_1_0_00000001 local_d29;
  ParseEffect local_d28;
  undefined **local_d08;
  DebugLocation local_d00;
  Located<const_char_*> local_cf8;
  anon_class_32_2_bb469d8f local_ce8;
  ParseEffect local_cc8;
  undefined **local_ca8;
  DebugLocation local_ca0;
  Located<const_char_*> local_c98;
  anon_class_1_0_00000001 local_c81;
  ParseEffect local_c80;
  undefined **local_c60;
  DebugLocation local_c58;
  Located<const_char_*> local_c50;
  anon_class_1_0_00000001 local_c39;
  ParseEffect local_c38;
  undefined **local_c18;
  DebugLocation local_c10;
  Located<const_char_*> local_c08;
  anon_class_1_0_00000001 local_bf1;
  ParseEffect local_bf0;
  undefined **local_bd0;
  DebugLocation local_bc8;
  Located<const_char_*> local_bc0;
  anon_class_32_2_f34bd3a1 local_bb0;
  ParseEffect local_b90;
  undefined **local_b70;
  DebugLocation local_b68;
  Located<const_char_*> local_b60;
  anon_class_1_0_00000001 local_b49;
  ParseEffect local_b48;
  undefined **local_b28;
  DebugLocation local_b20;
  Located<const_char_*> local_b18;
  anon_class_1_0_00000001 local_b01;
  ParseEffect local_b00;
  undefined **local_ae0;
  DebugLocation local_ad8;
  Located<const_char_*> local_ad0;
  anon_class_1_0_00000001 local_ab9;
  ParseEffect local_ab8;
  undefined **local_a98;
  DebugLocation local_a90;
  Located<const_char_*> local_a88;
  anon_class_1_0_00000001 local_a71;
  ParseEffect local_a70;
  undefined **local_a50;
  DebugLocation local_a48;
  Located<const_char_*> local_a40;
  anon_class_1_0_00000001 local_a29;
  ParseEffect local_a28;
  undefined **local_a08;
  DebugLocation local_a00;
  Located<const_char_*> local_9f8;
  anon_class_1_0_00000001 local_9e1;
  ParseEffect local_9e0;
  undefined **local_9c0;
  DebugLocation local_9b8;
  Located<const_char_*> local_9b0;
  anon_class_1_0_00000001 local_999;
  ParseEffect local_998;
  undefined **local_978;
  DebugLocation local_970;
  Located<const_char_*> local_968;
  anon_class_1_0_00000001 local_951;
  ParseEffect local_950;
  undefined **local_930;
  DebugLocation local_928;
  Located<const_char_*> local_920;
  anon_class_1_0_00000001 local_909;
  ParseEffect local_908;
  undefined **local_8e8;
  DebugLocation local_8e0;
  Located<const_char_*> local_8d8;
  anon_class_16_1_5a8de1ea local_8c8;
  ParseEffect local_8b8;
  undefined **local_898;
  DebugLocation local_890;
  Located<const_char_*> local_888;
  anon_class_16_1_5a8de1ea local_878;
  ParseEffect local_868;
  undefined **local_848;
  DebugLocation local_840;
  Located<const_char_*> local_838;
  anon_class_16_1_5a8de1ea local_828;
  ParseEffect local_818;
  undefined **local_7f8;
  DebugLocation local_7f0;
  Located<const_char_*> local_7e8;
  anon_class_16_1_5a8de1ea local_7d8;
  ParseEffect local_7c8;
  undefined **local_7a8;
  DebugLocation local_7a0;
  Located<const_char_*> local_798;
  anon_class_16_1_5a8de1ea local_788;
  ParseEffect local_778;
  undefined **local_758;
  DebugLocation local_750;
  Located<const_char_*> local_748;
  anon_class_16_1_5a8de1ea local_738;
  ParseEffect local_728;
  undefined **local_708;
  DebugLocation local_700;
  Located<const_char_*> local_6f8;
  anon_class_1_0_00000001 local_6e1;
  ParseEffect local_6e0;
  undefined **local_6c0;
  DebugLocation local_6b8;
  Located<const_char_*> local_6b0;
  anon_class_16_1_5a8de1ea local_6a0;
  ParseEffect local_690;
  undefined **local_670;
  DebugLocation local_668;
  Located<const_char_*> local_660;
  anon_class_1_0_00000001 local_649;
  ParseEffect local_648;
  undefined **local_628;
  DebugLocation local_620;
  Located<const_char_*> local_618;
  anon_class_1_0_00000001 local_601;
  ParseEffect local_600;
  undefined **local_5e0;
  DebugLocation local_5d8;
  Located<const_char_*> local_5d0;
  anon_class_16_1_5a8de1ea local_5c0;
  ParseEffect local_5b0;
  undefined **local_590;
  DebugLocation local_588;
  Located<const_char_*> local_580;
  anon_class_16_1_5a8de1ea local_570;
  ParseEffect local_560;
  undefined **local_540;
  DebugLocation local_538;
  Located<const_char_*> local_530;
  anon_class_16_1_5a8de1ea local_520;
  ParseEffect local_510;
  undefined **local_4f0;
  DebugLocation local_4e8;
  Located<const_char_*> local_4e0;
  trieste *local_4d0;
  undefined1 local_4c8 [32];
  trieste local_4a8 [16];
  trieste local_498 [16];
  trieste local_488 [16];
  trieste local_478 [16];
  trieste local_468 [16];
  trieste local_458 [16];
  trieste local_448 [16];
  trieste local_438 [16];
  trieste local_428 [16];
  trieste local_418 [16];
  trieste local_408 [16];
  trieste local_3f8 [16];
  trieste local_3e8 [16];
  trieste local_3d8 [16];
  trieste local_3c8 [16];
  trieste local_3b8 [16];
  trieste local_3a8 [16];
  trieste local_398 [16];
  trieste local_388 [16];
  trieste local_378 [16];
  trieste local_368 [16];
  trieste local_358 [16];
  trieste local_348 [16];
  trieste local_338 [16];
  trieste local_328 [16];
  trieste local_318 [16];
  trieste local_308 [16];
  trieste local_2f8 [16];
  trieste local_2e8 [16];
  trieste local_2d8 [16];
  trieste local_2c8 [16];
  trieste local_2b8 [16];
  trieste local_2a8 [16];
  trieste local_298 [16];
  trieste local_288 [16];
  trieste local_278 [16];
  trieste local_268 [16];
  trieste local_258 [16];
  trieste local_248 [16];
  trieste local_238 [16];
  trieste local_228 [16];
  trieste local_218 [16];
  trieste local_208 [16];
  trieste local_1f8 [16];
  trieste local_1e8 [16];
  trieste local_1d8 [16];
  trieste local_1c8 [16];
  trieste local_1b8 [16];
  trieste local_1a8 [16];
  trieste local_198 [16];
  trieste local_188 [16];
  shared_ptr<trieste::detail::RuleDef> local_178;
  allocator<char> local_161;
  string local_160;
  anon_class_32_2_06da41f9 local_140;
  PostF local_120;
  anon_class_1_0_00000001 local_f9;
  PostF local_f8;
  anon_class_16_1_696861bf local_d8;
  PreF local_c8;
  anon_class_1_0_00000001 local_a1;
  PreF local_a0;
  undefined1 local_80 [8];
  shared_ptr<trieste::Location> start_location;
  shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> indent;
  shared_ptr<Str> str;
  undefined1 local_48 [8];
  shared_ptr<unsigned_long> depth;
  undefined1 local_28 [8];
  shared_ptr<re2::RE2> re_dir;
  Parse *p;
  
  re_dir.super___shared_ptr<re2::RE2,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ = 0;
  trieste::Parse::Parse(in_RDI,subdirectories,(Wellformed *)wfParser);
  ::std::make_shared<re2::RE2,char_const(&)[27]>((char (*) [27])local_28);
  ::std::make_shared<unsigned_long,int>((int *)local_48);
  ::std::make_shared<verona::parser()::Str>();
  ::std::make_shared<std::vector<unsigned_long,std::allocator<unsigned_long>>>();
  ::std::make_shared<trieste::Location>();
  this = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
         ::std::
         __shared_ptr_access<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
         ::operator->((__shared_ptr_access<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&start_location.
                          super___shared_ptr<trieste::Location,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(this,&restart);
  ::std::function<bool(trieste::Parse_const&,std::filesystem::__cxx11::path_const&)>::
  function<verona::parser()::__0,void>
            ((function<bool(trieste::Parse_const&,std::filesystem::__cxx11::path_const&)> *)
             &local_a0,&local_a1);
  trieste::Parse::prefile(in_RDI,&local_a0);
  CLI::std::function<bool_(const_trieste::Parse_&,_const_std::filesystem::__cxx11::path_&)>::
  ~function(&local_a0);
  ::std::shared_ptr<re2::RE2>::shared_ptr(&local_d8.re_dir,(shared_ptr<re2::RE2> *)local_28);
  ::std::function<bool(trieste::Parse_const&,std::filesystem::__cxx11::path_const&)>::
  function<verona::parser()::__1,void>
            ((function<bool(trieste::Parse_const&,std::filesystem::__cxx11::path_const&)> *)
             &local_c8,&local_d8);
  trieste::Parse::predir(in_RDI,&local_c8);
  CLI::std::function<bool_(const_trieste::Parse_&,_const_std::filesystem::__cxx11::path_&)>::
  ~function(&local_c8);
  parser()::$_1::~__1((__1 *)&local_d8);
  ::std::
  function<void(trieste::Parse_const&,std::filesystem::__cxx11::path_const&,std::shared_ptr<trieste::NodeDef>)>
  ::function<verona::parser()::__2,void>
            ((function<void(trieste::Parse_const&,std::filesystem::__cxx11::path_const&,std::shared_ptr<trieste::NodeDef>)>
              *)&local_f8,&local_f9);
  trieste::Parse::postparse(in_RDI,&local_f8);
  CLI::std::
  function<void_(const_trieste::Parse_&,_const_std::filesystem::__cxx11::path_&,_std::shared_ptr<trieste::NodeDef>)>
  ::~function(&local_f8);
  ::std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::shared_ptr
            (&local_140.indent,
             (shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
             &start_location.super___shared_ptr<trieste::Location,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  ::std::shared_ptr<unsigned_long>::shared_ptr
            (&local_140.depth,(shared_ptr<unsigned_long> *)local_48);
  ::std::
  function<void(trieste::Parse_const&,std::filesystem::__cxx11::path_const&,std::shared_ptr<trieste::NodeDef>)>
  ::function<verona::parser()::__3,void>
            ((function<void(trieste::Parse_const&,std::filesystem::__cxx11::path_const&,std::shared_ptr<trieste::NodeDef>)>
              *)&local_120,&local_140);
  trieste::Parse::postfile(in_RDI,&local_120);
  CLI::std::
  function<void_(const_trieste::Parse_&,_const_std::filesystem::__cxx11::path_&,_std::shared_ptr<trieste::NodeDef>)>
  ::~function(&local_120);
  parser()::$_3::~__3((__3 *)&local_140);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,"start",&local_161);
  local_1432 = 1;
  local_4d0 = (trieste *)local_4c8;
  local_4f0 = &PTR_s__workspace_llm4binary_github_lic_00499f08;
  trieste::detail::DebugLocation::DebugLocation(&local_4e8,(source_location)0x499f08);
  trieste::detail::Located<const_char_*>::Located
            (&local_4e0,"\r?\n(?:[[:blank:]]*\r?\n)+([[:blank:]]*)",local_4e8);
  ::std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::shared_ptr
            (&local_520.indent,
             (shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
             &start_location.super___shared_ptr<trieste::Location,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  ::std::function<void(trieste::detail::Make&)>::function<verona::parser()::__4,void>
            ((function<void(trieste::detail::Make&)> *)&local_510,&local_520);
  trieste::operator>>((trieste *)local_4c8,local_4e0,&local_510);
  local_540 = &PTR_s__workspace_llm4binary_github_lic_00499f20;
  local_4d0 = (trieste *)(local_4c8 + 0x10);
  trieste::detail::DebugLocation::DebugLocation(&local_538,(source_location)0x499f20);
  trieste::detail::Located<const_char_*>::Located
            (&local_530,"\r?\n([[:blank:]]*(\\{)[[:blank:]]*)",local_538);
  ::std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::shared_ptr
            (&local_570.indent,
             (shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
             &start_location.super___shared_ptr<trieste::Location,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  ::std::function<void(trieste::detail::Make&)>::function<verona::parser()::__5,void>
            ((function<void(trieste::detail::Make&)> *)&local_560,&local_570);
  trieste::operator>>((trieste *)(local_4c8 + 0x10),local_530,&local_560);
  local_590 = &PTR_s__workspace_llm4binary_github_lic_00499f38;
  local_4d0 = local_4a8;
  trieste::detail::DebugLocation::DebugLocation(&local_588,(source_location)0x499f38);
  trieste::detail::Located<const_char_*>::Located(&local_580,"\r?\n([[:blank:]]*)",local_588);
  ::std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::shared_ptr
            (&local_5c0.indent,
             (shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
             &start_location.super___shared_ptr<trieste::Location,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  ::std::function<void(trieste::detail::Make&)>::function<verona::parser()::__6,void>
            ((function<void(trieste::detail::Make&)> *)&local_5b0,&local_5c0);
  trieste::operator>>(local_4a8,local_580,&local_5b0);
  local_5e0 = &PTR_s__workspace_llm4binary_github_lic_00499f50;
  local_4d0 = local_498;
  trieste::detail::DebugLocation::DebugLocation(&local_5d8,(source_location)0x499f50);
  trieste::detail::Located<const_char_*>::Located(&local_5d0,"[[:blank:]]+",local_5d8);
  ::std::function<void(trieste::detail::Make&)>::function<verona::parser()::__7,void>
            ((function<void(trieste::detail::Make&)> *)&local_600,&local_601);
  trieste::operator>>(local_498,local_5d0,&local_600);
  local_628 = &PTR_s__workspace_llm4binary_github_lic_00499f68;
  local_4d0 = local_488;
  trieste::detail::DebugLocation::DebugLocation(&local_620,(source_location)0x499f68);
  trieste::detail::Located<const_char_*>::Located(&local_618,";",local_620);
  ::std::function<void(trieste::detail::Make&)>::function<verona::parser()::__8,void>
            ((function<void(trieste::detail::Make&)> *)&local_648,&local_649);
  trieste::operator>>(local_488,local_618,&local_648);
  local_670 = &PTR_s__workspace_llm4binary_github_lic_00499f80;
  local_4d0 = local_478;
  trieste::detail::DebugLocation::DebugLocation(&local_668,(source_location)0x499f80);
  trieste::detail::Located<const_char_*>::Located(&local_660,"=>",local_668);
  ::std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::shared_ptr
            (&local_6a0.indent,
             (shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
             &start_location.super___shared_ptr<trieste::Location,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  ::std::function<void(trieste::detail::Make&)>::function<verona::parser()::__9,void>
            ((function<void(trieste::detail::Make&)> *)&local_690,&local_6a0);
  trieste::operator>>(local_478,local_660,&local_690);
  local_6c0 = &PTR_s__workspace_llm4binary_github_lic_00499f98;
  local_4d0 = local_468;
  trieste::detail::DebugLocation::DebugLocation(&local_6b8,(source_location)0x499f98);
  trieste::detail::Located<const_char_*>::Located(&local_6b0,",",local_6b8);
  ::std::function<void(trieste::detail::Make&)>::function<verona::parser()::__10,void>
            ((function<void(trieste::detail::Make&)> *)&local_6e0,&local_6e1);
  trieste::operator>>(local_468,local_6b0,&local_6e0);
  local_708 = &PTR_s__workspace_llm4binary_github_lic_00499fb0;
  local_4d0 = local_458;
  trieste::detail::DebugLocation::DebugLocation(&local_700,(source_location)0x499fb0);
  trieste::detail::Located<const_char_*>::Located(&local_6f8,"(\\()[[:blank:]]*",local_700);
  ::std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::shared_ptr
            (&local_738.indent,
             (shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
             &start_location.super___shared_ptr<trieste::Location,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  ::std::function<void(trieste::detail::Make&)>::function<verona::parser()::__11,void>
            ((function<void(trieste::detail::Make&)> *)&local_728,&local_738);
  trieste::operator>>(local_458,local_6f8,&local_728);
  local_758 = &PTR_s__workspace_llm4binary_github_lic_00499fc8;
  local_4d0 = local_448;
  trieste::detail::DebugLocation::DebugLocation(&local_750,(source_location)0x499fc8);
  trieste::detail::Located<const_char_*>::Located(&local_748,"\\)",local_750);
  ::std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::shared_ptr
            (&local_788.indent,
             (shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
             &start_location.super___shared_ptr<trieste::Location,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  ::std::function<void(trieste::detail::Make&)>::function<verona::parser()::__12,void>
            ((function<void(trieste::detail::Make&)> *)&local_778,&local_788);
  trieste::operator>>(local_448,local_748,&local_778);
  local_7a8 = &PTR_s__workspace_llm4binary_github_lic_00499fe0;
  local_4d0 = local_438;
  trieste::detail::DebugLocation::DebugLocation(&local_7a0,(source_location)0x499fe0);
  trieste::detail::Located<const_char_*>::Located(&local_798,"(\\[)[[:blank:]]*",local_7a0);
  ::std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::shared_ptr
            (&local_7d8.indent,
             (shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
             &start_location.super___shared_ptr<trieste::Location,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  ::std::function<void(trieste::detail::Make&)>::function<verona::parser()::__13,void>
            ((function<void(trieste::detail::Make&)> *)&local_7c8,&local_7d8);
  trieste::operator>>(local_438,local_798,&local_7c8);
  local_7f8 = &PTR_s__workspace_llm4binary_github_lic_00499ff8;
  local_4d0 = local_428;
  trieste::detail::DebugLocation::DebugLocation(&local_7f0,(source_location)0x499ff8);
  trieste::detail::Located<const_char_*>::Located(&local_7e8,"\\]",local_7f0);
  ::std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::shared_ptr
            (&local_828.indent,
             (shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
             &start_location.super___shared_ptr<trieste::Location,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  ::std::function<void(trieste::detail::Make&)>::function<verona::parser()::__14,void>
            ((function<void(trieste::detail::Make&)> *)&local_818,&local_828);
  trieste::operator>>(local_428,local_7e8,&local_818);
  local_848 = &PTR_s__workspace_llm4binary_github_lic_0049a010;
  local_4d0 = local_418;
  trieste::detail::DebugLocation::DebugLocation(&local_840,(source_location)0x49a010);
  trieste::detail::Located<const_char_*>::Located(&local_838,"(\\{)[[:blank:]]*",local_840);
  ::std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::shared_ptr
            (&local_878.indent,
             (shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
             &start_location.super___shared_ptr<trieste::Location,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  ::std::function<void(trieste::detail::Make&)>::function<verona::parser()::__15,void>
            ((function<void(trieste::detail::Make&)> *)&local_868,&local_878);
  trieste::operator>>(local_418,local_838,&local_868);
  local_898 = &PTR_s__workspace_llm4binary_github_lic_0049a028;
  local_4d0 = local_408;
  trieste::detail::DebugLocation::DebugLocation(&local_890,(source_location)0x49a028);
  trieste::detail::Located<const_char_*>::Located(&local_888,"\\}",local_890);
  ::std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::shared_ptr
            (&local_8c8.indent,
             (shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
             &start_location.super___shared_ptr<trieste::Location,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  ::std::function<void(trieste::detail::Make&)>::function<verona::parser()::__16,void>
            ((function<void(trieste::detail::Make&)> *)&local_8b8,&local_8c8);
  trieste::operator>>(local_408,local_888,&local_8b8);
  local_8e8 = &PTR_s__workspace_llm4binary_github_lic_0049a040;
  local_4d0 = local_3f8;
  trieste::detail::DebugLocation::DebugLocation(&local_8e0,(source_location)0x49a040);
  trieste::detail::Located<const_char_*>::Located(&local_8d8,"true\\b",local_8e0);
  ::std::function<void(trieste::detail::Make&)>::function<verona::parser()::__17,void>
            ((function<void(trieste::detail::Make&)> *)&local_908,&local_909);
  trieste::operator>>(local_3f8,local_8d8,&local_908);
  local_930 = &PTR_s__workspace_llm4binary_github_lic_0049a058;
  local_4d0 = local_3e8;
  trieste::detail::DebugLocation::DebugLocation(&local_928,(source_location)0x49a058);
  trieste::detail::Located<const_char_*>::Located(&local_920,"false\\b",local_928);
  ::std::function<void(trieste::detail::Make&)>::function<verona::parser()::__18,void>
            ((function<void(trieste::detail::Make&)> *)&local_950,&local_951);
  trieste::operator>>(local_3e8,local_920,&local_950);
  local_978 = &PTR_s__workspace_llm4binary_github_lic_0049a070;
  local_4d0 = local_3d8;
  trieste::detail::DebugLocation::DebugLocation(&local_970,(source_location)0x49a070);
  trieste::detail::Located<const_char_*>::Located
            (&local_968,"0x[_[:xdigit:]]+\\.[_[:xdigit:]]+(?:p[+-][_[:digit:]]+)?\\b",local_970);
  ::std::function<void(trieste::detail::Make&)>::function<verona::parser()::__19,void>
            ((function<void(trieste::detail::Make&)> *)&local_998,&local_999);
  trieste::operator>>(local_3d8,local_968,&local_998);
  local_9c0 = &PTR_s__workspace_llm4binary_github_lic_0049a088;
  local_4d0 = local_3c8;
  trieste::detail::DebugLocation::DebugLocation(&local_9b8,(source_location)0x49a088);
  trieste::detail::Located<const_char_*>::Located
            (&local_9b0,"[[:digit:]][_[:digit:]]*\\.[_[:digit:]]+(?:e[+-]?[_[:digit:]]+)?\\b",
             local_9b8);
  ::std::function<void(trieste::detail::Make&)>::function<verona::parser()::__20,void>
            ((function<void(trieste::detail::Make&)> *)&local_9e0,&local_9e1);
  trieste::operator>>(local_3c8,local_9b0,&local_9e0);
  local_a08 = &PTR_s__workspace_llm4binary_github_lic_0049a0a0;
  local_4d0 = local_3b8;
  trieste::detail::DebugLocation::DebugLocation(&local_a00,(source_location)0x49a0a0);
  trieste::detail::Located<const_char_*>::Located(&local_9f8,"0b[_01]+\\b",local_a00);
  ::std::function<void(trieste::detail::Make&)>::function<verona::parser()::__21,void>
            ((function<void(trieste::detail::Make&)> *)&local_a28,&local_a29);
  trieste::operator>>(local_3b8,local_9f8,&local_a28);
  local_a50 = &PTR_s__workspace_llm4binary_github_lic_0049a0b8;
  local_4d0 = local_3a8;
  trieste::detail::DebugLocation::DebugLocation(&local_a48,(source_location)0x49a0b8);
  trieste::detail::Located<const_char_*>::Located(&local_a40,"0o[_01234567]+\\b",local_a48);
  ::std::function<void(trieste::detail::Make&)>::function<verona::parser()::__22,void>
            ((function<void(trieste::detail::Make&)> *)&local_a70,&local_a71);
  trieste::operator>>(local_3a8,local_a40,&local_a70);
  local_a98 = &PTR_s__workspace_llm4binary_github_lic_0049a0d0;
  local_4d0 = local_398;
  trieste::detail::DebugLocation::DebugLocation(&local_a90,(source_location)0x49a0d0);
  trieste::detail::Located<const_char_*>::Located(&local_a88,"0x[_[:xdigit:]]+\\b",local_a90);
  ::std::function<void(trieste::detail::Make&)>::function<verona::parser()::__23,void>
            ((function<void(trieste::detail::Make&)> *)&local_ab8,&local_ab9);
  trieste::operator>>(local_398,local_a88,&local_ab8);
  local_ae0 = &PTR_s__workspace_llm4binary_github_lic_0049a0e8;
  local_4d0 = local_388;
  trieste::detail::DebugLocation::DebugLocation(&local_ad8,(source_location)0x49a0e8);
  trieste::detail::Located<const_char_*>::Located
            (&local_ad0,"[[:digit:]][_[:digit:]]*\\b",local_ad8);
  ::std::function<void(trieste::detail::Make&)>::function<verona::parser()::__24,void>
            ((function<void(trieste::detail::Make&)> *)&local_b00,&local_b01);
  trieste::operator>>(local_388,local_ad0,&local_b00);
  local_b28 = &PTR_s__workspace_llm4binary_github_lic_0049a100;
  local_4d0 = local_378;
  trieste::detail::DebugLocation::DebugLocation(&local_b20,(source_location)0x49a100);
  trieste::detail::Located<const_char_*>::Located(&local_b18,"\"((?:\\\"|[^\"])*?)\"",local_b20);
  ::std::function<void(trieste::detail::Make&)>::function<verona::parser()::__25,void>
            ((function<void(trieste::detail::Make&)> *)&local_b48,&local_b49);
  trieste::operator>>(local_378,local_b18,&local_b48);
  local_b70 = &PTR_s__workspace_llm4binary_github_lic_0049a118;
  local_4d0 = local_368;
  trieste::detail::DebugLocation::DebugLocation(&local_b68,(source_location)0x49a118);
  trieste::detail::Located<const_char_*>::Located(&local_b60,"([\']+)\"([^\"]*)",local_b68);
  ::std::shared_ptr<Str>::shared_ptr
            (&local_bb0.str,
             (shared_ptr<Str> *)
             &indent.
              super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  ::std::shared_ptr<trieste::Location>::shared_ptr
            (&local_bb0.start_location,(shared_ptr<trieste::Location> *)local_80);
  ::std::function<void(trieste::detail::Make&)>::function<verona::parser()::__26,void>
            ((function<void(trieste::detail::Make&)> *)&local_b90,&local_bb0);
  trieste::operator>>(local_368,local_b60,&local_b90);
  local_bd0 = &PTR_s__workspace_llm4binary_github_lic_0049a130;
  local_4d0 = local_358;
  trieste::detail::DebugLocation::DebugLocation(&local_bc8,(source_location)0x49a130);
  trieste::detail::Located<const_char_*>::Located(&local_bc0,"\'((?:\\\'|[^\'])*)\'",local_bc8);
  ::std::function<void(trieste::detail::Make&)>::function<verona::parser()::__27,void>
            ((function<void(trieste::detail::Make&)> *)&local_bf0,&local_bf1);
  trieste::operator>>(local_358,local_bc0,&local_bf0);
  local_c18 = &PTR_s__workspace_llm4binary_github_lic_0049a148;
  local_4d0 = local_348;
  trieste::detail::DebugLocation::DebugLocation(&local_c10,(source_location)0x49a148);
  trieste::detail::Located<const_char_*>::Located
            (&local_c08,":\\[((?:[^\\]]|\\][^:])*)\\]:",local_c10);
  ::std::function<void(trieste::detail::Make&)>::function<verona::parser()::__28,void>
            ((function<void(trieste::detail::Make&)> *)&local_c38,&local_c39);
  trieste::operator>>(local_348,local_c08,&local_c38);
  local_c60 = &PTR_s__workspace_llm4binary_github_lic_0049a160;
  local_4d0 = local_338;
  trieste::detail::DebugLocation::DebugLocation(&local_c58,(source_location)0x49a160);
  trieste::detail::Located<const_char_*>::Located(&local_c50,"//[^\r\n]*",local_c58);
  ::std::function<void(trieste::detail::Make&)>::function<verona::parser()::__29,void>
            ((function<void(trieste::detail::Make&)> *)&local_c80,&local_c81);
  trieste::operator>>(local_338,local_c50,&local_c80);
  local_ca8 = &PTR_s__workspace_llm4binary_github_lic_0049a178;
  local_4d0 = local_328;
  trieste::detail::DebugLocation::DebugLocation(&local_ca0,(source_location)0x49a178);
  trieste::detail::Located<const_char_*>::Located(&local_c98,"/\\*",local_ca0);
  ::std::shared_ptr<unsigned_long>::shared_ptr
            (&local_ce8.depth,(shared_ptr<unsigned_long> *)local_48);
  ::std::shared_ptr<trieste::Location>::shared_ptr
            (&local_ce8.start_location,(shared_ptr<trieste::Location> *)local_80);
  ::std::function<void(trieste::detail::Make&)>::function<verona::parser()::__30,void>
            ((function<void(trieste::detail::Make&)> *)&local_cc8,&local_ce8);
  trieste::operator>>(local_328,local_c98,&local_cc8);
  local_d08 = &PTR_s__workspace_llm4binary_github_lic_0049a190;
  local_4d0 = local_318;
  trieste::detail::DebugLocation::DebugLocation(&local_d00,(source_location)0x49a190);
  trieste::detail::Located<const_char_*>::Located(&local_cf8,"use\\b",local_d00);
  ::std::function<void(trieste::detail::Make&)>::function<verona::parser()::__31,void>
            ((function<void(trieste::detail::Make&)> *)&local_d28,&local_d29);
  trieste::operator>>(local_318,local_cf8,&local_d28);
  local_d50 = &PTR_s__workspace_llm4binary_github_lic_0049a1a8;
  local_4d0 = local_308;
  trieste::detail::DebugLocation::DebugLocation(&local_d48,(source_location)0x49a1a8);
  trieste::detail::Located<const_char_*>::Located(&local_d40,"type\\b",local_d48);
  ::std::function<void(trieste::detail::Make&)>::function<verona::parser()::__32,void>
            ((function<void(trieste::detail::Make&)> *)&local_d70,&local_d71);
  trieste::operator>>(local_308,local_d40,&local_d70);
  local_d98 = &PTR_s__workspace_llm4binary_github_lic_0049a1c0;
  local_4d0 = local_2f8;
  trieste::detail::DebugLocation::DebugLocation(&local_d90,(source_location)0x49a1c0);
  trieste::detail::Located<const_char_*>::Located(&local_d88,"class\\b",local_d90);
  ::std::function<void(trieste::detail::Make&)>::function<verona::parser()::__33,void>
            ((function<void(trieste::detail::Make&)> *)&local_db8,&local_db9);
  trieste::operator>>(local_2f8,local_d88,&local_db8);
  local_de0 = &PTR_s__workspace_llm4binary_github_lic_0049a1d8;
  local_4d0 = local_2e8;
  trieste::detail::DebugLocation::DebugLocation(&local_dd8,(source_location)0x49a1d8);
  trieste::detail::Located<const_char_*>::Located(&local_dd0,"where\\b",local_dd8);
  ::std::function<void(trieste::detail::Make&)>::function<verona::parser()::__34,void>
            ((function<void(trieste::detail::Make&)> *)&local_e00,&local_e01);
  trieste::operator>>(local_2e8,local_dd0,&local_e00);
  local_e28 = &PTR_s__workspace_llm4binary_github_lic_0049a1f0;
  local_4d0 = local_2d8;
  trieste::detail::DebugLocation::DebugLocation(&local_e20,(source_location)0x49a1f0);
  trieste::detail::Located<const_char_*>::Located(&local_e18,"var\\b",local_e20);
  ::std::function<void(trieste::detail::Make&)>::function<verona::parser()::__35,void>
            ((function<void(trieste::detail::Make&)> *)&local_e48,&local_e49);
  trieste::operator>>(local_2d8,local_e18,&local_e48);
  local_e70 = &PTR_s__workspace_llm4binary_github_lic_0049a208;
  local_4d0 = local_2c8;
  trieste::detail::DebugLocation::DebugLocation(&local_e68,(source_location)0x49a208);
  trieste::detail::Located<const_char_*>::Located(&local_e60,"let\\b",local_e68);
  ::std::function<void(trieste::detail::Make&)>::function<verona::parser()::__36,void>
            ((function<void(trieste::detail::Make&)> *)&local_e90,&local_e91);
  trieste::operator>>(local_2c8,local_e60,&local_e90);
  local_eb8 = &PTR_s__workspace_llm4binary_github_lic_0049a220;
  local_4d0 = local_2b8;
  trieste::detail::DebugLocation::DebugLocation(&local_eb0,(source_location)0x49a220);
  trieste::detail::Located<const_char_*>::Located(&local_ea8,"ref\\b",local_eb0);
  ::std::function<void(trieste::detail::Make&)>::function<verona::parser()::__37,void>
            ((function<void(trieste::detail::Make&)> *)&local_ed8,&local_ed9);
  trieste::operator>>(local_2b8,local_ea8,&local_ed8);
  local_f00 = &PTR_s__workspace_llm4binary_github_lic_0049a238;
  local_4d0 = local_2a8;
  trieste::detail::DebugLocation::DebugLocation(&local_ef8,(source_location)0x49a238);
  trieste::detail::Located<const_char_*>::Located(&local_ef0,"Self\\b",local_ef8);
  ::std::function<void(trieste::detail::Make&)>::function<verona::parser()::__38,void>
            ((function<void(trieste::detail::Make&)> *)&local_f20,&local_f21);
  trieste::operator>>(local_2a8,local_ef0,&local_f20);
  local_f48 = &PTR_s__workspace_llm4binary_github_lic_0049a250;
  local_4d0 = local_298;
  trieste::detail::DebugLocation::DebugLocation(&local_f40,(source_location)0x49a250);
  trieste::detail::Located<const_char_*>::Located(&local_f38,"if\\b",local_f40);
  ::std::function<void(trieste::detail::Make&)>::function<verona::parser()::__39,void>
            ((function<void(trieste::detail::Make&)> *)&local_f68,&local_f69);
  trieste::operator>>(local_298,local_f38,&local_f68);
  local_f90 = &PTR_s__workspace_llm4binary_github_lic_0049a268;
  local_4d0 = local_288;
  trieste::detail::DebugLocation::DebugLocation(&local_f88,(source_location)0x49a268);
  trieste::detail::Located<const_char_*>::Located(&local_f80,"else\\b",local_f88);
  ::std::function<void(trieste::detail::Make&)>::function<verona::parser()::__40,void>
            ((function<void(trieste::detail::Make&)> *)&local_fb0,&local_fb1);
  trieste::operator>>(local_288,local_f80,&local_fb0);
  local_fd8 = &PTR_s__workspace_llm4binary_github_lic_0049a280;
  local_4d0 = local_278;
  trieste::detail::DebugLocation::DebugLocation(&local_fd0,(source_location)0x49a280);
  trieste::detail::Located<const_char_*>::Located(&local_fc8,"new\\b",local_fd0);
  ::std::function<void(trieste::detail::Make&)>::function<verona::parser()::__41,void>
            ((function<void(trieste::detail::Make&)> *)&local_ff8,&local_ff9);
  trieste::operator>>(local_278,local_fc8,&local_ff8);
  local_1020 = &PTR_s__workspace_llm4binary_github_lic_0049a298;
  local_4d0 = local_268;
  trieste::detail::DebugLocation::DebugLocation(&local_1018,(source_location)0x49a298);
  trieste::detail::Located<const_char_*>::Located(&local_1010,"try\\b",local_1018);
  ::std::function<void(trieste::detail::Make&)>::function<verona::parser()::__42,void>
            ((function<void(trieste::detail::Make&)> *)&local_1040,&local_1041);
  trieste::operator>>(local_268,local_1010,&local_1040);
  local_1068 = &PTR_s__workspace_llm4binary_github_lic_0049a2b0;
  local_4d0 = local_258;
  trieste::detail::DebugLocation::DebugLocation(&local_1060,(source_location)0x49a2b0);
  trieste::detail::Located<const_char_*>::Located(&local_1058,"iso\\b",local_1060);
  ::std::function<void(trieste::detail::Make&)>::function<verona::parser()::__43,void>
            ((function<void(trieste::detail::Make&)> *)&local_1088,&local_1089);
  trieste::operator>>(local_258,local_1058,&local_1088);
  local_10b0 = &PTR_s__workspace_llm4binary_github_lic_0049a2c8;
  local_4d0 = local_248;
  trieste::detail::DebugLocation::DebugLocation(&local_10a8,(source_location)0x49a2c8);
  trieste::detail::Located<const_char_*>::Located(&local_10a0,"mut\\b",local_10a8);
  ::std::function<void(trieste::detail::Make&)>::function<verona::parser()::__44,void>
            ((function<void(trieste::detail::Make&)> *)&local_10d0,&local_10d1);
  trieste::operator>>(local_248,local_10a0,&local_10d0);
  local_10f8 = &PTR_s__workspace_llm4binary_github_lic_0049a2e0;
  local_4d0 = local_238;
  trieste::detail::DebugLocation::DebugLocation(&local_10f0,(source_location)0x49a2e0);
  trieste::detail::Located<const_char_*>::Located(&local_10e8,"imm\\b",local_10f0);
  ::std::function<void(trieste::detail::Make&)>::function<verona::parser()::__45,void>
            ((function<void(trieste::detail::Make&)> *)&local_1118,&local_1119);
  trieste::operator>>(local_238,local_10e8,&local_1118);
  local_1140 = &PTR_s__workspace_llm4binary_github_lic_0049a2f8;
  local_4d0 = local_228;
  trieste::detail::DebugLocation::DebugLocation(&local_1138,(source_location)0x49a2f8);
  trieste::detail::Located<const_char_*>::Located(&local_1130,"_\\b",local_1138);
  ::std::function<void(trieste::detail::Make&)>::function<verona::parser()::__46,void>
            ((function<void(trieste::detail::Make&)> *)&local_1160,&local_1161);
  trieste::operator>>(local_228,local_1130,&local_1160);
  local_1188 = &PTR_s__workspace_llm4binary_github_lic_0049a310;
  local_4d0 = local_218;
  trieste::detail::DebugLocation::DebugLocation(&local_1180,(source_location)0x49a310);
  trieste::detail::Located<const_char_*>::Located(&local_1178,"_(?:_)+\\b",local_1180);
  ::std::function<void(trieste::detail::Make&)>::function<verona::parser()::__47,void>
            ((function<void(trieste::detail::Make&)> *)&local_11a8,&local_11a9);
  trieste::operator>>(local_218,local_1178,&local_11a8);
  local_11d0 = &PTR_s__workspace_llm4binary_github_lic_0049a328;
  local_4d0 = local_208;
  trieste::detail::DebugLocation::DebugLocation(&local_11c8,(source_location)0x49a328);
  trieste::detail::Located<const_char_*>::Located
            (&local_11c0,"[_[:alpha:]][_[:alnum:]]*\\b",local_11c8);
  ::std::function<void(trieste::detail::Make&)>::function<verona::parser()::__48,void>
            ((function<void(trieste::detail::Make&)> *)&local_11f0,&local_11f1);
  trieste::operator>>(local_208,local_11c0,&local_11f0);
  local_1218 = &PTR_s__workspace_llm4binary_github_lic_0049a340;
  local_4d0 = local_1f8;
  trieste::detail::DebugLocation::DebugLocation(&local_1210,(source_location)0x49a340);
  trieste::detail::Located<const_char_*>::Located(&local_1208,"\\.\\.\\.",local_1210);
  ::std::function<void(trieste::detail::Make&)>::function<verona::parser()::__49,void>
            ((function<void(trieste::detail::Make&)> *)&local_1238,&local_1239);
  trieste::operator>>(local_1f8,local_1208,&local_1238);
  local_1260 = &PTR_s__workspace_llm4binary_github_lic_0049a358;
  local_4d0 = local_1e8;
  trieste::detail::DebugLocation::DebugLocation(&local_1258,(source_location)0x49a358);
  trieste::detail::Located<const_char_*>::Located(&local_1250,"\\.",local_1258);
  ::std::function<void(trieste::detail::Make&)>::function<verona::parser()::__50,void>
            ((function<void(trieste::detail::Make&)> *)&local_1280,&local_1281);
  trieste::operator>>(local_1e8,local_1250,&local_1280);
  local_12a8 = &PTR_s__workspace_llm4binary_github_lic_0049a370;
  local_4d0 = local_1d8;
  trieste::detail::DebugLocation::DebugLocation(&local_12a0,(source_location)0x49a370);
  trieste::detail::Located<const_char_*>::Located(&local_1298,":::",local_12a0);
  ::std::function<void(trieste::detail::Make&)>::function<verona::parser()::__51,void>
            ((function<void(trieste::detail::Make&)> *)&local_12c8,&local_12c9);
  trieste::operator>>(local_1d8,local_1298,&local_12c8);
  local_12f0 = &PTR_s__workspace_llm4binary_github_lic_0049a388;
  local_4d0 = local_1c8;
  trieste::detail::DebugLocation::DebugLocation(&local_12e8,(source_location)0x49a388);
  trieste::detail::Located<const_char_*>::Located(&local_12e0,"::",local_12e8);
  ::std::function<void(trieste::detail::Make&)>::function<verona::parser()::__52,void>
            ((function<void(trieste::detail::Make&)> *)&local_1310,&local_1311);
  trieste::operator>>(local_1c8,local_12e0,&local_1310);
  local_1338 = &PTR_s__workspace_llm4binary_github_lic_0049a3a0;
  local_4d0 = local_1b8;
  trieste::detail::DebugLocation::DebugLocation(&local_1330,(source_location)0x49a3a0);
  trieste::detail::Located<const_char_*>::Located(&local_1328,":",local_1330);
  ::std::function<void(trieste::detail::Make&)>::function<verona::parser()::__53,void>
            ((function<void(trieste::detail::Make&)> *)&local_1358,&local_1359);
  trieste::operator>>(local_1b8,local_1328,&local_1358);
  local_1380 = &PTR_s__workspace_llm4binary_github_lic_0049a3b8;
  local_4d0 = local_1a8;
  trieste::detail::DebugLocation::DebugLocation(&local_1378,(source_location)0x49a3b8);
  trieste::detail::Located<const_char_*>::Located(&local_1370,"=[!#$%&*+-/<=>?@\\^`|~]+",local_1378)
  ;
  ::std::function<void(trieste::detail::Make&)>::function<verona::parser()::__54,void>
            ((function<void(trieste::detail::Make&)> *)&local_13a0,&local_13a1);
  trieste::operator>>(local_1a8,local_1370,&local_13a0);
  local_13c8 = &PTR_s__workspace_llm4binary_github_lic_0049a3d0;
  local_4d0 = local_198;
  trieste::detail::DebugLocation::DebugLocation(&local_13c0,(source_location)0x49a3d0);
  trieste::detail::Located<const_char_*>::Located(&local_13b8,"=",local_13c0);
  ::std::function<void(trieste::detail::Make&)>::function<verona::parser()::__55,void>
            ((function<void(trieste::detail::Make&)> *)&local_13e8,&local_13e9);
  trieste::operator>>(local_198,local_13b8,&local_13e8);
  local_1410 = &PTR_s__workspace_llm4binary_github_lic_0049a3e8;
  local_4d0 = local_188;
  trieste::detail::DebugLocation::DebugLocation(&local_1408,(source_location)0x49a3e8);
  trieste::detail::Located<const_char_*>::Located(&local_1400,"[!#$%&*+-/<=>?@\\^`|~]+",local_1408);
  ::std::function<void(trieste::detail::Make&)>::function<verona::parser()::__56,void>
            ((function<void(trieste::detail::Make&)> *)&local_1430,&local_1431);
  trieste::operator>>(local_188,local_1400,&local_1430);
  local_1432 = 0;
  local_178.super___shared_ptr<trieste::detail::RuleDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_4c8;
  local_178.super___shared_ptr<trieste::detail::RuleDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x35;
  r_01._M_len = 0x35;
  r_01._M_array =
       (iterator)
       local_178.super___shared_ptr<trieste::detail::RuleDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  trieste::Parse::operator()(in_RDI,&local_160,r_01);
  local_1de0 = &local_178;
  do {
    local_1de0 = local_1de0 + -1;
    CLI::std::shared_ptr<trieste::detail::RuleDef>::~shared_ptr(local_1de0);
  } while (local_1de0 != (shared_ptr<trieste::detail::RuleDef> *)local_4c8);
  CLI::std::function<void_(trieste::detail::Make_&)>::~function(&local_1430);
  CLI::std::function<void_(trieste::detail::Make_&)>::~function(&local_13e8);
  CLI::std::function<void_(trieste::detail::Make_&)>::~function(&local_13a0);
  CLI::std::function<void_(trieste::detail::Make_&)>::~function(&local_1358);
  CLI::std::function<void_(trieste::detail::Make_&)>::~function(&local_1310);
  CLI::std::function<void_(trieste::detail::Make_&)>::~function(&local_12c8);
  CLI::std::function<void_(trieste::detail::Make_&)>::~function(&local_1280);
  CLI::std::function<void_(trieste::detail::Make_&)>::~function(&local_1238);
  CLI::std::function<void_(trieste::detail::Make_&)>::~function(&local_11f0);
  CLI::std::function<void_(trieste::detail::Make_&)>::~function(&local_11a8);
  CLI::std::function<void_(trieste::detail::Make_&)>::~function(&local_1160);
  CLI::std::function<void_(trieste::detail::Make_&)>::~function(&local_1118);
  CLI::std::function<void_(trieste::detail::Make_&)>::~function(&local_10d0);
  CLI::std::function<void_(trieste::detail::Make_&)>::~function(&local_1088);
  CLI::std::function<void_(trieste::detail::Make_&)>::~function(&local_1040);
  CLI::std::function<void_(trieste::detail::Make_&)>::~function(&local_ff8);
  CLI::std::function<void_(trieste::detail::Make_&)>::~function(&local_fb0);
  CLI::std::function<void_(trieste::detail::Make_&)>::~function(&local_f68);
  CLI::std::function<void_(trieste::detail::Make_&)>::~function(&local_f20);
  CLI::std::function<void_(trieste::detail::Make_&)>::~function(&local_ed8);
  CLI::std::function<void_(trieste::detail::Make_&)>::~function(&local_e90);
  CLI::std::function<void_(trieste::detail::Make_&)>::~function(&local_e48);
  CLI::std::function<void_(trieste::detail::Make_&)>::~function(&local_e00);
  CLI::std::function<void_(trieste::detail::Make_&)>::~function(&local_db8);
  CLI::std::function<void_(trieste::detail::Make_&)>::~function(&local_d70);
  CLI::std::function<void_(trieste::detail::Make_&)>::~function(&local_d28);
  CLI::std::function<void_(trieste::detail::Make_&)>::~function(&local_cc8);
  parser()::$_30::~__30((__30 *)&local_ce8);
  CLI::std::function<void_(trieste::detail::Make_&)>::~function(&local_c80);
  CLI::std::function<void_(trieste::detail::Make_&)>::~function(&local_c38);
  CLI::std::function<void_(trieste::detail::Make_&)>::~function(&local_bf0);
  CLI::std::function<void_(trieste::detail::Make_&)>::~function(&local_b90);
  parser()::$_26::~__26((__26 *)&local_bb0);
  CLI::std::function<void_(trieste::detail::Make_&)>::~function(&local_b48);
  CLI::std::function<void_(trieste::detail::Make_&)>::~function(&local_b00);
  CLI::std::function<void_(trieste::detail::Make_&)>::~function(&local_ab8);
  CLI::std::function<void_(trieste::detail::Make_&)>::~function(&local_a70);
  CLI::std::function<void_(trieste::detail::Make_&)>::~function(&local_a28);
  CLI::std::function<void_(trieste::detail::Make_&)>::~function(&local_9e0);
  CLI::std::function<void_(trieste::detail::Make_&)>::~function(&local_998);
  CLI::std::function<void_(trieste::detail::Make_&)>::~function(&local_950);
  CLI::std::function<void_(trieste::detail::Make_&)>::~function(&local_908);
  CLI::std::function<void_(trieste::detail::Make_&)>::~function(&local_8b8);
  parser()::$_16::~__16((__16 *)&local_8c8);
  CLI::std::function<void_(trieste::detail::Make_&)>::~function(&local_868);
  parser()::$_15::~__15((__15 *)&local_878);
  CLI::std::function<void_(trieste::detail::Make_&)>::~function(&local_818);
  parser()::$_14::~__14((__14 *)&local_828);
  CLI::std::function<void_(trieste::detail::Make_&)>::~function(&local_7c8);
  parser()::$_13::~__13((__13 *)&local_7d8);
  CLI::std::function<void_(trieste::detail::Make_&)>::~function(&local_778);
  parser()::$_12::~__12((__12 *)&local_788);
  CLI::std::function<void_(trieste::detail::Make_&)>::~function(&local_728);
  parser()::$_11::~__11((__11 *)&local_738);
  CLI::std::function<void_(trieste::detail::Make_&)>::~function(&local_6e0);
  CLI::std::function<void_(trieste::detail::Make_&)>::~function(&local_690);
  parser()::$_9::~__9((__9 *)&local_6a0);
  CLI::std::function<void_(trieste::detail::Make_&)>::~function(&local_648);
  CLI::std::function<void_(trieste::detail::Make_&)>::~function(&local_600);
  CLI::std::function<void_(trieste::detail::Make_&)>::~function(&local_5b0);
  parser()::$_6::~__6((__6 *)&local_5c0);
  CLI::std::function<void_(trieste::detail::Make_&)>::~function(&local_560);
  parser()::$_5::~__5((__5 *)&local_570);
  CLI::std::function<void_(trieste::detail::Make_&)>::~function(&local_510);
  parser()::$_4::~__4((__4 *)&local_520);
  ::std::__cxx11::string::~string((string *)&local_160);
  ::std::allocator<char>::~allocator(&local_161);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_1458,"string",&local_1459);
  local_1599 = 1;
  local_14a8 = (trieste *)local_14a0;
  local_14c8 = &PTR_s__workspace_llm4binary_github_lic_0049a400;
  trieste::detail::DebugLocation::DebugLocation(&local_14c0,(source_location)0x49a400);
  trieste::detail::Located<const_char_*>::Located(&local_14b8,"\"\'",local_14c0);
  ::std::shared_ptr<Str>::shared_ptr
            (&local_14f8.str,
             (shared_ptr<Str> *)
             &indent.
              super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  ::std::function<void(trieste::detail::Make&)>::function<verona::parser()::__57,void>
            ((function<void(trieste::detail::Make&)> *)&local_14e8,&local_14f8);
  trieste::operator>>((trieste *)local_14a0,local_14b8,&local_14e8);
  local_1518 = &PTR_s__workspace_llm4binary_github_lic_0049a418;
  local_14a8 = (trieste *)(local_14a0 + 0x10);
  trieste::detail::DebugLocation::DebugLocation(&local_1510,(source_location)0x49a418);
  trieste::detail::Located<const_char_*>::Located(&local_1508,"\'",local_1510);
  ::std::shared_ptr<Str>::shared_ptr
            (&local_1548.str,
             (shared_ptr<Str> *)
             &indent.
              super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  ::std::function<void(trieste::detail::Make&)>::function<verona::parser()::__58,void>
            ((function<void(trieste::detail::Make&)> *)&local_1538,&local_1548);
  trieste::operator>>((trieste *)(local_14a0 + 0x10),local_1508,&local_1538);
  local_1568 = &PTR_s__workspace_llm4binary_github_lic_0049a430;
  local_14a8 = local_1480;
  trieste::detail::DebugLocation::DebugLocation(&local_1560,(source_location)0x49a430);
  trieste::detail::Located<const_char_*>::Located(&local_1558,".",local_1560);
  ::std::shared_ptr<Str>::shared_ptr
            (&local_1598.str,
             (shared_ptr<Str> *)
             &indent.
              super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  ::std::function<void(trieste::detail::Make&)>::function<verona::parser()::__59,void>
            ((function<void(trieste::detail::Make&)> *)&local_1588,&local_1598);
  trieste::operator>>(local_1480,local_1558,&local_1588);
  local_1599 = 0;
  local_1470.super___shared_ptr<trieste::detail::RuleDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_14a0;
  local_1470.super___shared_ptr<trieste::detail::RuleDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3;
  r_00._M_len = 3;
  r_00._M_array =
       (iterator)
       local_1470.super___shared_ptr<trieste::detail::RuleDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  trieste::Parse::operator()(in_RDI,&local_1458,r_00);
  local_1e28 = &local_1470;
  do {
    local_1e28 = local_1e28 + -1;
    CLI::std::shared_ptr<trieste::detail::RuleDef>::~shared_ptr(local_1e28);
  } while (local_1e28 != (shared_ptr<trieste::detail::RuleDef> *)local_14a0);
  CLI::std::function<void_(trieste::detail::Make_&)>::~function(&local_1588);
  parser()::$_59::~__59((__59 *)&local_1598);
  CLI::std::function<void_(trieste::detail::Make_&)>::~function(&local_1538);
  parser()::$_58::~__58((__58 *)&local_1548);
  CLI::std::function<void_(trieste::detail::Make_&)>::~function(&local_14e8);
  parser()::$_57::~__57((__57 *)&local_14f8);
  ::std::__cxx11::string::~string((string *)&local_1458);
  ::std::allocator<char>::~allocator(&local_1459);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_15c0,"comment",&local_15c1);
  local_174a = 1;
  local_1620 = (trieste *)local_1618;
  local_1640 = &PTR_s__workspace_llm4binary_github_lic_0049a448;
  trieste::detail::DebugLocation::DebugLocation(&local_1638,(source_location)0x49a448);
  trieste::detail::Located<const_char_*>::Located(&local_1630,"[^/\\*]+",local_1638);
  ::std::function<void(trieste::detail::Make&)>::function<verona::parser()::__60,void>
            ((function<void(trieste::detail::Make&)> *)&local_1660,&local_1661);
  trieste::operator>>((trieste *)local_1618,local_1630,&local_1660);
  local_1688 = &PTR_s__workspace_llm4binary_github_lic_0049a460;
  local_1620 = (trieste *)(local_1618 + 0x10);
  trieste::detail::DebugLocation::DebugLocation(&local_1680,(source_location)0x49a460);
  trieste::detail::Located<const_char_*>::Located(&local_1678,"/\\*",local_1680);
  ::std::shared_ptr<unsigned_long>::shared_ptr
            (&local_16b8.depth,(shared_ptr<unsigned_long> *)local_48);
  ::std::function<void(trieste::detail::Make&)>::function<verona::parser()::__61,void>
            ((function<void(trieste::detail::Make&)> *)&local_16a8,&local_16b8);
  trieste::operator>>((trieste *)(local_1618 + 0x10),local_1678,&local_16a8);
  local_16d8 = &PTR_s__workspace_llm4binary_github_lic_0049a478;
  local_1620 = local_15f8;
  trieste::detail::DebugLocation::DebugLocation(&local_16d0,(source_location)0x49a478);
  trieste::detail::Located<const_char_*>::Located(&local_16c8,"\\*/",local_16d0);
  ::std::shared_ptr<unsigned_long>::shared_ptr
            (&local_1708.depth,(shared_ptr<unsigned_long> *)local_48);
  ::std::function<void(trieste::detail::Make&)>::function<verona::parser()::__62,void>
            ((function<void(trieste::detail::Make&)> *)&local_16f8,&local_1708);
  trieste::operator>>(local_15f8,local_16c8,&local_16f8);
  local_1728 = &PTR_s__workspace_llm4binary_github_lic_0049a490;
  local_1620 = local_15e8;
  trieste::detail::DebugLocation::DebugLocation(&local_1720,(source_location)0x49a490);
  trieste::detail::Located<const_char_*>::Located(&local_1718,"[/\\*]",local_1720);
  ::std::function<void(trieste::detail::Make&)>::function<verona::parser()::__63,void>
            ((function<void(trieste::detail::Make&)> *)&local_1748,&local_1749);
  trieste::operator>>(local_15e8,local_1718,&local_1748);
  local_174a = 0;
  local_15d8.super___shared_ptr<trieste::detail::RuleDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_1618;
  local_15d8.super___shared_ptr<trieste::detail::RuleDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x4;
  r._M_len = 4;
  r._M_array = (iterator)
               local_15d8.super___shared_ptr<trieste::detail::RuleDef,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
  trieste::Parse::operator()(in_RDI,&local_15c0,r);
  local_1e80 = &local_15d8;
  do {
    local_1e80 = local_1e80 + -1;
    CLI::std::shared_ptr<trieste::detail::RuleDef>::~shared_ptr(local_1e80);
  } while (local_1e80 != (shared_ptr<trieste::detail::RuleDef> *)local_1618);
  CLI::std::function<void_(trieste::detail::Make_&)>::~function(&local_1748);
  CLI::std::function<void_(trieste::detail::Make_&)>::~function(&local_16f8);
  parser()::$_62::~__62((__62 *)&local_1708);
  CLI::std::function<void_(trieste::detail::Make_&)>::~function(&local_16a8);
  parser()::$_61::~__61((__61 *)&local_16b8);
  CLI::std::function<void_(trieste::detail::Make_&)>::~function(&local_1660);
  ::std::__cxx11::string::~string((string *)&local_15c0);
  ::std::allocator<char>::~allocator(&local_15c1);
  ::std::shared_ptr<trieste::Location>::shared_ptr
            (&local_1780.start_location,(shared_ptr<trieste::Location> *)local_80);
  ::std::function<void(trieste::detail::Make&)>::function<verona::parser()::__64,void>
            ((function<void(trieste::detail::Make&)> *)&local_1770,&local_1780);
  trieste::Parse::done(in_RDI,&local_1770);
  CLI::std::function<void_(trieste::detail::Make_&)>::~function(&local_1770);
  parser()::$_64::~__64((__64 *)&local_1780);
  local_18d8 = &local_18d0;
  trieste::Token::Token(&local_18e0,(TokenDef *)Int);
  ::std::
  function<std::__cxx11::string(xoroshiro::detail::XorOshiro<unsigned_long,unsigned_int,55ul,14ul,36ul>&)>
  ::function<verona::parser()::__65,void>
            ((function<std::__cxx11::string(xoroshiro::detail::XorOshiro<unsigned_long,unsigned_int,55ul,14ul,36ul>&)>
              *)&local_1900,&local_1901);
  trieste::operator>>(&local_18d0,&local_18e0,&local_1900);
  local_18d8 = &local_18a8;
  trieste::Token::Token(&local_1910,(TokenDef *)Hex);
  ::std::
  function<std::__cxx11::string(xoroshiro::detail::XorOshiro<unsigned_long,unsigned_int,55ul,14ul,36ul>&)>
  ::function<verona::parser()::__66,void>
            ((function<std::__cxx11::string(xoroshiro::detail::XorOshiro<unsigned_long,unsigned_int,55ul,14ul,36ul>&)>
              *)&local_1930,&local_1931);
  trieste::operator>>(&local_18a8,&local_1910,&local_1930);
  local_18d8 = &local_1880;
  trieste::Token::Token(&local_1940,(TokenDef *)Bin);
  ::std::
  function<std::__cxx11::string(xoroshiro::detail::XorOshiro<unsigned_long,unsigned_int,55ul,14ul,36ul>&)>
  ::function<verona::parser()::__67,void>
            ((function<std::__cxx11::string(xoroshiro::detail::XorOshiro<unsigned_long,unsigned_int,55ul,14ul,36ul>&)>
              *)&local_1960,&local_1961);
  trieste::operator>>(&local_1880,&local_1940,&local_1960);
  local_18d8 = &local_1858;
  trieste::Token::Token(&local_1970,(TokenDef *)Float);
  ::std::
  function<std::__cxx11::string(xoroshiro::detail::XorOshiro<unsigned_long,unsigned_int,55ul,14ul,36ul>&)>
  ::function<verona::parser()::__68,void>
            ((function<std::__cxx11::string(xoroshiro::detail::XorOshiro<unsigned_long,unsigned_int,55ul,14ul,36ul>&)>
              *)&local_1990,&local_1991);
  trieste::operator>>(&local_1858,&local_1970,&local_1990);
  local_18d8 = &local_1830;
  trieste::Token::Token(&local_19a0,(TokenDef *)HexFloat);
  ::std::
  function<std::__cxx11::string(xoroshiro::detail::XorOshiro<unsigned_long,unsigned_int,55ul,14ul,36ul>&)>
  ::function<verona::parser()::__69,void>
            ((function<std::__cxx11::string(xoroshiro::detail::XorOshiro<unsigned_long,unsigned_int,55ul,14ul,36ul>&)>
              *)&local_19c0,&local_19c1);
  trieste::operator>>(&local_1830,&local_19a0,&local_19c0);
  local_18d8 = &local_1808;
  trieste::Token::Token(&local_19d0,(TokenDef *)Char);
  ::std::
  function<std::__cxx11::string(xoroshiro::detail::XorOshiro<unsigned_long,unsigned_int,55ul,14ul,36ul>&)>
  ::function<verona::parser()::__70,void>
            ((function<std::__cxx11::string(xoroshiro::detail::XorOshiro<unsigned_long,unsigned_int,55ul,14ul,36ul>&)>
              *)&local_19f0,&local_19f1);
  trieste::operator>>(&local_1808,&local_19d0,&local_19f0);
  local_18d8 = &local_17e0;
  trieste::Token::Token(&local_1a00,(TokenDef *)Escaped);
  ::std::
  function<std::__cxx11::string(xoroshiro::detail::XorOshiro<unsigned_long,unsigned_int,55ul,14ul,36ul>&)>
  ::function<verona::parser()::__71,void>
            ((function<std::__cxx11::string(xoroshiro::detail::XorOshiro<unsigned_long,unsigned_int,55ul,14ul,36ul>&)>
              *)&local_1a20,&local_1a21);
  trieste::operator>>(&local_17e0,&local_1a00,&local_1a20);
  local_18d8 = &local_17b8;
  trieste::Token::Token(&local_1a30,(TokenDef *)String);
  ::std::
  function<std::__cxx11::string(xoroshiro::detail::XorOshiro<unsigned_long,unsigned_int,55ul,14ul,36ul>&)>
  ::function<verona::parser()::__72,void>
            ((function<std::__cxx11::string(xoroshiro::detail::XorOshiro<unsigned_long,unsigned_int,55ul,14ul,36ul>&)>
              *)&local_1a50,&local_1a51);
  trieste::operator>>(&local_17b8,&local_1a30,&local_1a50);
  local_1790._0_8_ = &local_18d0;
  local_1790._8_8_ = 8;
  g._M_len = 8;
  g._M_array = (iterator)local_1790._0_8_;
  trieste::Parse::gen(in_RDI,g);
  local_1f18 = (pair<trieste::Token,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>_>
                *)local_1790;
  do {
    local_1f18 = local_1f18 + -1;
    ::std::
    pair<trieste::Token,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>_>
    ::~pair(local_1f18);
  } while (local_1f18 != &local_18d0);
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>
  ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>
               *)&local_1a50);
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>
  ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>
               *)&local_1a20);
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>
  ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>
               *)&local_19f0);
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>
  ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>
               *)&local_19c0);
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>
  ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>
               *)&local_1990);
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>
  ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>
               *)&local_1960);
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>
  ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>
               *)&local_1930);
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>
  ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>
               *)&local_1900);
  re_dir.super___shared_ptr<re2::RE2,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ = 1;
  ::std::shared_ptr<trieste::Location>::~shared_ptr((shared_ptr<trieste::Location> *)local_80);
  ::std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::~shared_ptr
            ((shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
             &start_location.super___shared_ptr<trieste::Location,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  ::std::shared_ptr<Str>::~shared_ptr
            ((shared_ptr<Str> *)
             &indent.
              super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  ::std::shared_ptr<unsigned_long>::~shared_ptr((shared_ptr<unsigned_long> *)local_48);
  ::std::shared_ptr<re2::RE2>::~shared_ptr((shared_ptr<re2::RE2> *)local_28);
  if ((re_dir.super___shared_ptr<re2::RE2,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ & 1)
      == 0) {
    trieste::Parse::~Parse(in_RDI);
  }
  return in_RDI;
}

Assistant:

Parse parser()
  {
    struct Str
    {
      size_t start = 0;
      size_t end = 0;
    };

    Parse p(depth::subdirectories, wfParser);
    auto re_dir = std::make_shared<RE2>("[_[:alpha:]][_[:alnum:]]*?");
    auto depth = std::make_shared<size_t>(0);
    auto str = std::make_shared<Str>();
    auto indent = std::make_shared<std::vector<size_t>>();
    auto start_location = std::make_shared<Location>();
    indent->push_back(restart);

    p.prefile([](auto&, auto& path) { return path.extension() == ".verona"; });

    p.predir([re_dir](auto&, auto& path) {
      return RE2::FullMatch(path.filename().string(), *re_dir);
    });

    p.postparse([](auto& pp, auto& path, auto ast) {
      if (options().no_std)
        return;

      auto stdlib = pp.executable().parent_path() / "std";
      if (path != stdlib)
        ast << pp.sub_parse(stdlib);
    });

    p.postfile([indent, depth](auto&, auto&, auto) {
      *depth = 0;
      indent->clear();
      indent->push_back(restart);
    });

    p("start",
      {
        // Blank lines terminate.
        "\r?\n(?:[[:blank:]]*\r?\n)+([[:blank:]]*)" >>
          [indent](auto& m) {
            indent->back() = m.match(1).len;
            m.term(terminators);
          },

        // A newline that starts a brace block doesn't terminate.
        "\r?\n([[:blank:]]*(\\{)[[:blank:]]*)" >>
          [indent](auto& m) {
            indent->push_back(m.match(1).len);
            m.push(Brace, 2);
          },

        // A newline sometimes terminates.
        "\r?\n([[:blank:]]*)" >>
          [indent](auto& m) {
            size_t col = m.match(1).len;

            // If following a brace, don't terminate, but reset indentation.
            if (m.previous(Brace))
            {
              indent->back() = col;
              return;
            }

            // Don't terminate and don't reset indentation if:
            // * in an equals or list
            // * in a group and indented
            if (
              m.in(Equals) || m.in(List) ||
              (m.in(Group) && (col > indent->back())))
              return;

            // Otherwise, terminate and reset indentation.
            m.term(terminators);
            indent->back() = col;
          },

        // Whitespace between tokens.
        "[[:blank:]]+" >> [](auto&) {},

        // Terminator.
        ";" >> [](auto& m) { m.term(terminators); },

        // Lambda.
        "=>" >>
          [indent](auto& m) {
            indent->back() = m.match().linecol().second + 1;
            m.term(terminators);
            m.add(Arrow);
            m.term(terminators);
          },

        // List.
        "," >> [](auto& m) { m.seq(List, {Equals}); },

        // Parens.
        "(\\()[[:blank:]]*" >>
          [indent](auto& m) {
            indent->push_back(m.match().linecol().second + m.match().len);
            m.push(Paren, 1);
          },

        "\\)" >>
          [indent](auto& m) {
            indent->pop_back();
            m.term(terminators);
            m.pop(Paren);
          },

        // Square brackets.
        "(\\[)[[:blank:]]*" >>
          [indent](auto& m) {
            indent->push_back(m.match().linecol().second + m.match().len);
            m.push(Square, 1);
          },

        "\\]" >>
          [indent](auto& m) {
            indent->pop_back();
            m.term(terminators);
            m.pop(Square);
          },

        // Curly braces.
        "(\\{)[[:blank:]]*" >>
          [indent](auto& m) {
            indent->push_back(m.match().linecol().second + m.match().len);
            m.push(Brace, 1);
          },

        "\\}" >>
          [indent](auto& m) {
            indent->pop_back();
            m.term(terminators);
            m.pop(Brace);
          },

        // Bool.
        "true\\b" >> [](auto& m) { m.add(True); },
        "false\\b" >> [](auto& m) { m.add(False); },

        // Hex float.
        "0x[_[:xdigit:]]+\\.[_[:xdigit:]]+(?:p[+-][_[:digit:]]+)?\\b" >>
          [](auto& m) { m.add(HexFloat); },

        // Float.
        "[[:digit:]][_[:digit:]]*\\.[_[:digit:]]+(?:e[+-]?[_[:digit:]]+)?\\b" >>
          [](auto& m) { m.add(Float); },

        // Bin.
        "0b[_01]+\\b" >> [](auto& m) { m.add(Bin); },

        // Oct.
        "0o[_01234567]+\\b" >> [](auto& m) { m.add(Oct); },

        // Hex.
        "0x[_[:xdigit:]]+\\b" >> [](auto& m) { m.add(Hex); },

        // Int.
        "[[:digit:]][_[:digit:]]*\\b" >> [](auto& m) { m.add(Int); },

        // Escaped string.
        "\"((?:\\\"|[^\"])*?)\"" >> [](auto& m) { m.add(Escaped, 1); },

        // Unescaped string.
        "([']+)\"([^\"]*)" >>
          [str, start_location](auto& m) {
            str->start = m.match(1).len;
            str->end = 0;
            m.add(String, 2);
            *start_location = m.match(1);
            m.mode("string");
          },

        // Character literal.
        "'((?:\\'|[^'])*)'" >> [](auto& m) { m.add(Char, 1); },

        // LLVM IR literal.
        ":\\[((?:[^\\]]|\\][^:])*)\\]:" >> [](auto& m) { m.add(LLVM, 1); },

        // Line comment.
        "//[^\r\n]*" >> [](auto&) {},

        // Nested comment.
        "/\\*" >>
          [depth, start_location](auto& m) {
            assert(*depth == 0);
            ++(*depth);
            *start_location = m.match();
            m.mode("comment");
          },

        // Keywords.
        "use\\b" >>
          [](auto& m) {
            m.term(terminators);
            m.add(Use);
          },

        "type\\b" >>
          [](auto& m) {
            m.term(terminators);
            m.add(TypeAlias);
          },

        "class\\b" >>
          [](auto& m) {
            m.term(terminators);
            m.add(Class);
          },

        "where\\b" >> [](auto& m) { m.add(Where); },
        "var\\b" >> [](auto& m) { m.add(Var); },
        "let\\b" >> [](auto& m) { m.add(Let); },
        "ref\\b" >> [](auto& m) { m.add(Ref); },
        "Self\\b" >> [](auto& m) { m.add(Self); },
        "if\\b" >> [](auto& m) { m.add(If); },
        "else\\b" >> [](auto& m) { m.add(Else); },
        "new\\b" >> [](auto& m) { m.add(New); },
        "try\\b" >> [](auto& m) { m.add(Try); },
        "iso\\b" >> [](auto& m) { m.add(Iso); },
        "mut\\b" >> [](auto& m) { m.add(Mut); },
        "imm\\b" >> [](auto& m) { m.add(Imm); },

        // Don't care.
        "_\\b" >> [](auto& m) { m.add(DontCare); },

        // Reserve a sequence of underscores.
        "_(?:_)+\\b" >>
          [](auto& m) {
            m.error(
              "a sequence of two or more underscores is a reserved identifier");
          },

        // Identifier.
        "[_[:alpha:]][_[:alnum:]]*\\b" >> [](auto& m) { m.add(Ident); },

        // Ellipsis.
        "\\.\\.\\." >> [](auto& m) { m.add(Ellipsis); },

        // Dot.
        "\\." >> [](auto& m) { m.add(Dot); },

        // Triple colon.
        ":::" >> [](auto& m) { m.add(TripleColon); },

        // Double colon.
        "::" >> [](auto& m) { m.add(DoubleColon); },

        // Colon.
        ":" >> [](auto& m) { m.add(Colon); },

        // Symbol that starts with `=`.
        "=[!#$%&*+-/<=>?@\\^`|~]+" >> [](auto& m) { m.add(Symbol); },

        // Equals.
        "=" >> [](auto& m) { m.seq(Equals); },

        // Other symbols. Reserved: "'(),.:;[]_{}
        "[!#$%&*+-/<=>?@\\^`|~]+" >> [](auto& m) { m.add(Symbol); },
      });

    p("string",
      {
        "\"'" >>
          [str](auto& m) {
            m.extend_before(String);
            str->end = 1;
            if (str->start == str->end)
              m.mode("start");
          },

        "'" >>
          [str](auto& m) {
            if (str->end > 0)
            {
              str->end++;
              if (str->start == str->end)
                m.mode("start");
            }
          },

        "." >> [str](auto&) { str->end = 0; },
      });

    p("comment",
      {
        "[^/\\*]+" >> [](auto&) {},
        "/\\*" >> [depth](auto&) { ++(*depth); },

        "\\*/" >>
          [depth](auto& m) {
            if (--(*depth) == 0)
              m.mode("start");
          },

        "[/\\*]" >> [](auto&) {},
      });

    p.done([start_location](auto& m) {
      if (m.mode() == "comment")
        m.error("Unterminated comment starting at ", *start_location);

      if (m.mode() == "string")
        m.error("Unterminated string starting at ", *start_location);

      m.term(terminators);
    });

    p.gen({
      Int >> [](auto& rnd) { return std::to_string(rnd()); },
      Hex >> [](auto& rnd) { return fmt::format("{:#x}", rnd()); },
      Bin >> [](auto& rnd) { return fmt::format("{:#b}", rnd()); },
      Float >>
        [](auto& rnd) { return fmt::format("{:g}", random_double(rnd)); },
      HexFloat >>
        [](auto& rnd) { return fmt::format("{:a}", random_double(rnd)); },
      Char >>
        [](auto& rnd) {
          return unquote(fmt::format("{:?}", random_string(rnd, 1)));
        },
      Escaped >>
        [](auto& rnd) {
          return unquote(fmt::format("{:?}", random_string(rnd, 32)));
        },
      String >>
        [](auto& rnd) { return fmt::format("{}", random_string(rnd, 32)); },
    });

    return p;
  }